

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O1

QList<QBenchmarkMeasurerBase::Measurement> * __thiscall
QBenchmarkCallgrindMeasurer::stop
          (QList<QBenchmarkMeasurerBase::Measurement> *__return_storage_ptr__,
          QBenchmarkCallgrindMeasurer *this)

{
  qint64 qVar1;
  Measurement *pMVar2;
  long in_FS_OFFSET;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QArrayData *)0x43540000;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  qVar1 = QBenchmarkValgrindUtils::extractLastResult();
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pMVar2 = (Measurement *)QArrayData::allocate(&local_58,0x10,0x10,1,KeepSize);
  (__return_storage_ptr__->d).d = (Data *)local_58;
  (__return_storage_ptr__->d).ptr = pMVar2;
  (__return_storage_ptr__->d).size = 0;
  pMVar2->value = (double)qVar1;
  pMVar2->metric = InstructionReads;
  (__return_storage_ptr__->d).size = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QBenchmarkMeasurerBase::Measurement> QBenchmarkCallgrindMeasurer::stop()
{
    CALLGRIND_DUMP_STATS;
    const qint64 result = QBenchmarkValgrindUtils::extractLastResult();
    return { { qreal(result), QTest::InstructionReads } };
}